

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryCopy(OptimizeInstructions *this,MemoryCopy *memCopy)

{
  PassRunner *pPVar1;
  Name memory;
  Drop **this_00;
  bool bVar2;
  Store *pSVar3;
  int64_t iVar4;
  Load *value;
  ulong extraout_RDX;
  ulong uVar5;
  ulong extraout_RDX_00;
  uint bytes;
  initializer_list<wasm::Expression_*> *items;
  Expression *ptr;
  optional<wasm::Type> type;
  uintptr_t uStackY_80;
  size_t sVar6;
  char *pcVar7;
  Drop local_60;
  Drop local_48;
  Builder builder;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if ((((pPVar1->options).ignoreImplicitTraps != false) ||
      ((pPVar1->options).trapsNeverHappen == true)) &&
     (bVar2 = areConsecutiveInputsEqual(this,memCopy->dest,memCopy->source), bVar2)) {
    local_48.value =
         (Expression *)
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    this_00 = (Drop **)&local_48.value;
    local_60.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         Builder::makeDrop((Builder *)this_00,memCopy->dest);
    local_60.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)Builder::makeDrop((Builder *)this_00,memCopy->source);
    local_60.value = (Expression *)Builder::makeDrop((Builder *)this_00,memCopy->size);
    items = (initializer_list<wasm::Expression_*> *)&local_48;
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 3;
    uVar5 = extraout_RDX;
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = &local_60;
LAB_00ade20b:
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar5;
    pSVar3 = (Store *)Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                                ((Builder *)&local_48.value,items,type);
    return (Expression *)pSVar3;
  }
  if (memCopy->size->_id != ConstId) {
    return (Expression *)(Store *)0x0;
  }
  iVar4 = Literal::getInteger((Literal *)(memCopy->size + 1));
  local_48.value =
       (Expression *)
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  switch(iVar4) {
  case 0:
    if (((pPVar1->options).ignoreImplicitTraps != false) ||
       ((pPVar1->options).trapsNeverHappen == true)) {
      local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
           Builder::makeDrop((Builder *)&local_48.value,memCopy->dest);
      local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)Builder::makeDrop((Builder *)&local_48.value,memCopy->source);
      items = (initializer_list<wasm::Expression_*> *)&local_60;
      local_60.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 2;
      uVar5 = extraout_RDX_00;
      local_60.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = &local_48
      ;
      goto LAB_00ade20b;
    }
    break;
  case 1:
  case 2:
  case 4:
    ptr = memCopy->dest;
    bytes = (uint)iVar4;
    value = Builder::makeLoad((Builder *)&local_48.value,bytes,false,(Address)0x0,1,memCopy->source,
                              (Type)0x2,(Name)(memCopy->sourceMemory).super_IString.str);
    sVar6 = (memCopy->destMemory).super_IString.str._M_len;
    pcVar7 = (memCopy->destMemory).super_IString.str._M_str;
    uStackY_80 = 2;
    goto LAB_00ade363;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    ptr = memCopy->dest;
    bytes = 8;
    value = Builder::makeLoad((Builder *)&local_48.value,8,false,(Address)0x0,1,memCopy->source,
                              (Type)0x3,(Name)(memCopy->sourceMemory).super_IString.str);
    sVar6 = (memCopy->destMemory).super_IString.str._M_len;
    pcVar7 = (memCopy->destMemory).super_IString.str._M_str;
    uStackY_80 = 3;
LAB_00ade363:
    memory.super_IString.str._M_str = pcVar7;
    memory.super_IString.str._M_len = sVar6;
    pSVar3 = Builder::makeStore((Builder *)&local_48.value,bytes,(Address)0x0,1,ptr,
                                (Expression *)value,(Type)uStackY_80,memory);
    return (Expression *)pSVar3;
  default:
    if (((iVar4 == 0x10) && ((pPVar1->options).shrinkLevel == 0)) &&
       (((((Module *)local_48.value)->features).features & 8) != 0)) {
      ptr = memCopy->dest;
      bytes = 0x10;
      value = Builder::makeLoad((Builder *)&local_48.value,0x10,false,(Address)0x0,1,memCopy->source
                                ,(Type)0x6,(Name)(memCopy->sourceMemory).super_IString.str);
      sVar6 = (memCopy->destMemory).super_IString.str._M_len;
      pcVar7 = (memCopy->destMemory).super_IString.str._M_str;
      uStackY_80 = 6;
      goto LAB_00ade363;
    }
  }
  return (Expression *)(Store *)0x0;
}

Assistant:

Expression* optimizeMemoryCopy(MemoryCopy* memCopy) {
    auto& options = getPassOptions();

    if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
      if (areConsecutiveInputsEqual(memCopy->dest, memCopy->source)) {
        // memory.copy(x, x, sz)  ==>  {drop(x), drop(x), drop(sz)}
        Builder builder(*getModule());
        return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                  builder.makeDrop(memCopy->source),
                                  builder.makeDrop(memCopy->size)});
      }
    }

    // memory.copy(dst, src, C)  ==>  store(dst, load(src))
    if (auto* csize = memCopy->size->dynCast<Const>()) {
      auto bytes = csize->value.getInteger();
      Builder builder(*getModule());

      switch (bytes) {
        case 0: {
          if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
            // memory.copy(dst, src, 0)  ==>  {drop(dst), drop(src)}
            return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                      builder.makeDrop(memCopy->source)});
          }
          break;
        }
        case 1:
        case 2:
        case 4: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i32,
                                                    memCopy->sourceMemory),
                                   Type::i32,
                                   memCopy->destMemory);
        }
        case 8: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i64,
                                                    memCopy->sourceMemory),
                                   Type::i64,
                                   memCopy->destMemory);
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            // This adds an extra 2 bytes so apply it only for
            // minimal shrink level
            if (getModule()->features.hasSIMD()) {
              return builder.makeStore(bytes, // bytes
                                       0,     // offset
                                       1,     // align
                                       memCopy->dest,
                                       builder.makeLoad(bytes,
                                                        false,
                                                        0,
                                                        1,
                                                        memCopy->source,
                                                        Type::v128,
                                                        memCopy->sourceMemory),
                                       Type::v128,
                                       memCopy->destMemory);
            }
          }
          break;
        }
        default: {
        }
      }
    }
    return nullptr;
  }